

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O0

uint32_t FAudioCreateVolumeMeter(FAPO **ppApo,uint32_t Flags)

{
  uint32_t uVar1;
  FAudioReallocFunc unaff_retaddr;
  undefined4 in_stack_00000008;
  uint32_t in_stack_0000001c;
  FAPO **in_stack_00000020;
  
  uVar1 = FAudioCreateVolumeMeterWithCustomAllocatorEXT
                    (in_stack_00000020,in_stack_0000001c,(FAudioMallocFunc)ppApo,
                     (FAudioFreeFunc)CONCAT44(Flags,in_stack_00000008),unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t FAudioCreateVolumeMeter(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateVolumeMeterWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}